

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

int32_t __thiscall icu_63::ChineseCalendar::majorSolarTerm(ChineseCalendar *this,int32_t days)

{
  CalendarAstronomer *pCVar1;
  undefined4 in_register_00000034;
  size_t size;
  double dVar2;
  CalendarAstronomer *local_58;
  int local_44;
  int32_t term;
  UDate solarLongitude;
  int32_t days_local;
  ChineseCalendar *this_local;
  
  size = CONCAT44(in_register_00000034,days);
  umtx_lock_63(&astroLock);
  if (gChineseCalendarAstro == (CalendarAstronomer *)0x0) {
    pCVar1 = (CalendarAstronomer *)UMemory::operator_new((UMemory *)0x88,size);
    local_58 = (CalendarAstronomer *)0x0;
    if (pCVar1 != (CalendarAstronomer *)0x0) {
      CalendarAstronomer::CalendarAstronomer(pCVar1);
      local_58 = pCVar1;
    }
    gChineseCalendarAstro = local_58;
    ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
  }
  pCVar1 = gChineseCalendarAstro;
  dVar2 = daysToMillis(this,(double)days);
  CalendarAstronomer::setTime(pCVar1,dVar2);
  dVar2 = CalendarAstronomer::getSunLongitude(gChineseCalendarAstro);
  umtx_unlock_63(&astroLock);
  local_44 = ((int)((dVar2 * 6.0) / 3.141592653589793) + 2) % 0xc;
  if (local_44 < 1) {
    local_44 = local_44 + 0xc;
  }
  return local_44;
}

Assistant:

int32_t ChineseCalendar::majorSolarTerm(int32_t days) const {
    
    umtx_lock(&astroLock);
    if(gChineseCalendarAstro == NULL) {
        gChineseCalendarAstro = new CalendarAstronomer();
        ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
    }
    gChineseCalendarAstro->setTime(daysToMillis(days));
    UDate solarLongitude = gChineseCalendarAstro->getSunLongitude();
    umtx_unlock(&astroLock);

    // Compute (floor(solarLongitude / (pi/6)) + 2) % 12
    int32_t term = ( ((int32_t)(6 * solarLongitude / CalendarAstronomer::PI)) + 2 ) % 12;
    if (term < 1) {
        term += 12;
    }
    return term;
}